

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall cmComputeTargetDepends::CollectTargets(cmComputeTargetDepends *this)

{
  cmGlobalGenerator *pcVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  pointer ppcVar4;
  mapped_type_conflict *pmVar5;
  uint uVar6;
  __node_base *p_Var7;
  cmTarget *target;
  key_type local_38;
  
  pcVar1 = this->GlobalGenerator;
  uVar6 = 0;
  while( true ) {
    ppcVar2 = (pcVar1->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(pcVar1->LocalGenerators).
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar2 >> 3) <=
        (ulong)uVar6) break;
    p_Var7 = (__node_base *)((long)&(ppcVar2[uVar6]->Makefile->Targets)._M_h + 0x10);
    while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
      local_38 = (key_type)(p_Var7 + 5);
      ppcVar3 = (this->Targets).
                super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppcVar4 = (this->Targets).
                super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pmVar5 = std::
               map<const_cmTarget_*,_int,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_int>_>_>
               ::operator[](&this->TargetIndex,&local_38);
      *pmVar5 = (mapped_type_conflict)((ulong)((long)ppcVar3 - (long)ppcVar4) >> 3);
      std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::push_back
                (&this->Targets,&local_38);
    }
    uVar6 = uVar6 + 1;
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectTargets()
{
  // Collect all targets from all generators.
  std::vector<cmLocalGenerator*> const& lgens =
    this->GlobalGenerator->GetLocalGenerators();
  for(unsigned int i = 0; i < lgens.size(); ++i)
    {
    const cmTargets& targets = lgens[i]->GetMakefile()->GetTargets();
    for(cmTargets::const_iterator ti = targets.begin();
        ti != targets.end(); ++ti)
      {
      cmTarget const* target = &ti->second;
      int index = static_cast<int>(this->Targets.size());
      this->TargetIndex[target] = index;
      this->Targets.push_back(target);
      }
    }
}